

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O0

Score __thiscall
INetwork::ScoreModel(INetwork *this,Dataset *data,LossFunction lossFunction,bool onTest,Time time)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  Score SVar4;
  vector<float,_std::allocator<float>_> *local_80;
  int local_68;
  int sampleId;
  allocator<std::vector<float,_std::allocator<float>_>_> local_51;
  undefined1 local_50 [8];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  predictions;
  vector<float,_std::allocator<float>_> *labels;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *samples;
  Time time_local;
  bool onTest_local;
  LossFunction lossFunction_local;
  Dataset *data_local;
  INetwork *this_local;
  
  if (onTest) {
    local_80 = &data->yTest;
    data = (Dataset *)&data->xTest;
  }
  else {
    local_80 = &data->yTrain;
  }
  predictions.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_80;
  sVar1 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(&data->xTrain);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator(&local_51);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)local_50,sVar1,&local_51);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator(&local_51);
  for (local_68 = 0;
      sVar1 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::size(&data->xTrain), (ulong)(long)local_68 < sVar1; local_68 = local_68 + 1) {
    pvVar2 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](&data->xTrain,(long)local_68);
    pvVar3 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           *)local_50,(long)local_68);
    (*this->_vptr_INetwork[4])(time,this,pvVar2,pvVar3);
  }
  SVar4 = (*lossFunction)((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           *)local_50,
                          predictions.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)local_50);
  return SVar4;
}

Assistant:

SPIKING_NN::Score INetwork::ScoreModel( SPIKING_NN::Dataset &data, SPIKING_NN::LossFunction lossFunction, bool onTest,
                                        SPIKING_NN::Time time )
{
    std::vector<SPIKING_NN::Sample> &samples = ( onTest ? data.xTest : data.xTrain );
    std::vector<SPIKING_NN::Target> &labels = ( onTest ? data.yTest : data.yTrain );
    std::vector<SPIKING_NN::Output> predictions( samples.size());
    for ( int sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        Forward( samples[sampleId], predictions[sampleId], time );
    }
    return lossFunction( predictions, labels );
}